

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

void __thiscall jpgd::jpeg_decoder::read_sos_marker(jpeg_decoder *this)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  
  uVar2 = get_bits(this,0x10);
  uVar3 = get_bits(this,8);
  this->m_comps_in_scan = uVar3;
  if ((uVar3 - 5 < 0xfffffffc) || (uVar2 != uVar3 * 2 + 6)) {
    stop_decoding(this,JPGD_BAD_SOS_LENGTH);
  }
  if (0 < (int)uVar3) {
    uVar2 = (uVar2 - uVar3) - uVar3;
    uVar11 = 0;
    do {
      uVar4 = get_bits(this,8);
      uVar5 = get_bits(this,8);
      uVar8 = (ulong)this->m_comps_in_frame;
      bVar12 = 0 < (long)uVar8;
      if ((long)uVar8 < 1) {
LAB_001d7e28:
        stop_decoding(this,JPGD_BAD_SOS_COMP_ID);
      }
      if (uVar4 == this->m_comp_ident[0]) {
        uVar6 = 0;
      }
      else {
        uVar10 = 0;
        do {
          if (uVar8 - 1 == uVar10) goto LAB_001d7e28;
          uVar6 = uVar10 + 1;
          lVar1 = uVar10 + 1;
          uVar10 = uVar6;
        } while (uVar4 != this->m_comp_ident[lVar1]);
        bVar12 = uVar6 < uVar8;
      }
      if (!bVar12) goto LAB_001d7e28;
      if (3 < uVar6) {
LAB_001d7e35:
        stop_decoding(this,JPGD_DECODE_ERROR);
      }
      this->m_comp_list[uVar11] = (int)uVar6;
      uVar7 = uVar5 >> 4 & 0xf;
      this->m_comp_dc_tab[uVar6] = uVar7;
      this->m_comp_ac_tab[uVar6] = (uVar5 & 0xf) + 4;
      if ((7 < uVar7) || (3 < (uVar5 & 0xf))) goto LAB_001d7e35;
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar3);
  }
  uVar3 = get_bits(this,8);
  this->m_spectral_start = uVar3;
  uVar3 = get_bits(this,8);
  this->m_spectral_end = uVar3;
  uVar3 = get_bits(this,4);
  this->m_successive_high = uVar3;
  uVar3 = get_bits(this,4);
  this->m_successive_low = uVar3;
  if (this->m_progressive_flag == 0) {
    this->m_spectral_start = 0;
    this->m_spectral_end = 0x3f;
  }
  for (iVar9 = uVar2 - 6; iVar9 != 0; iVar9 = iVar9 + -1) {
    get_bits(this,8);
  }
  return;
}

Assistant:

void jpeg_decoder::read_sos_marker()
	{
		uint num_left;
		int i, ci, n, c, cc;

		num_left = get_bits(16);

		n = get_bits(8);

		m_comps_in_scan = n;

		num_left -= 3;

		if ((num_left != (uint)(n * 2 + 3)) || (n < 1) || (n > JPGD_MAX_COMPS_IN_SCAN))
			stop_decoding(JPGD_BAD_SOS_LENGTH);

		for (i = 0; i < n; i++)
		{
			cc = get_bits(8);
			c = get_bits(8);
			num_left -= 2;

			for (ci = 0; ci < m_comps_in_frame; ci++)
				if (cc == m_comp_ident[ci])
					break;

			if (ci >= m_comps_in_frame)
				stop_decoding(JPGD_BAD_SOS_COMP_ID);

			if (ci >= JPGD_MAX_COMPONENTS)
				stop_decoding(JPGD_DECODE_ERROR);

			m_comp_list[i] = ci;

			m_comp_dc_tab[ci] = (c >> 4) & 15;
			m_comp_ac_tab[ci] = (c & 15) + (JPGD_MAX_HUFF_TABLES >> 1);

			if (m_comp_dc_tab[ci] >= JPGD_MAX_HUFF_TABLES)
				stop_decoding(JPGD_DECODE_ERROR);

			if (m_comp_ac_tab[ci] >= JPGD_MAX_HUFF_TABLES)
				stop_decoding(JPGD_DECODE_ERROR);
		}

		m_spectral_start = get_bits(8);
		m_spectral_end = get_bits(8);
		m_successive_high = get_bits(4);
		m_successive_low = get_bits(4);

		if (!m_progressive_flag)
		{
			m_spectral_start = 0;
			m_spectral_end = 63;
		}

		num_left -= 3;

		/* read past whatever is num_left */
		while (num_left)
		{
			get_bits(8);
			num_left--;
		}
	}